

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O0

void __thiscall
UnixMakefileGenerator::writeDefaultVariables(UnixMakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *pQVar2;
  QTextStream *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000000c;
  ProString distname;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  QMakeProject *in_stack_fffffffffffffab0;
  QStringBuilder<ProString,_ProString> *this_00;
  QMakeProject *in_stack_fffffffffffffab8;
  ProKey *in_stack_fffffffffffffac0;
  QMakeProject *in_stack_fffffffffffffac8;
  QMakeProject *this_01;
  char *in_stack_fffffffffffffae8;
  bool local_4b1;
  undefined1 canon;
  QString *file;
  MakefileGenerator *in_stack_fffffffffffffb60;
  QTextStream *in_stack_fffffffffffffc50;
  MakefileGenerator *in_stack_fffffffffffffc58;
  undefined1 local_338 [24];
  undefined1 local_320 [288];
  undefined1 local_200 [264];
  undefined1 local_f8 [96];
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  undefined1 local_50 [48];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  MakefileGenerator::writeDefaultVariables(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"TAR           = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  (**(code **)&(in_RDI->d).d[0xb].super_QArrayData)(local_20,in_RDI,local_50);
  QTextStream::operator<<(pQVar2,(QString *)local_20);
  ::operator<<((QTextStream *)in_stack_fffffffffffffab0,
               (QTextStreamFunction)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QString::~QString((QString *)0x2194f5);
  ProKey::~ProKey((ProKey *)0x219502);
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"COMPRESS      = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  (**(code **)&(in_RDI->d).d[0xb].super_QArrayData)(local_68,in_RDI,local_98);
  QTextStream::operator<<(pQVar2,(QString *)local_68);
  ::operator<<((QTextStream *)in_stack_fffffffffffffab0,
               (QTextStreamFunction)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QString::~QString((QString *)0x219584);
  ProKey::~ProKey((ProKey *)0x219591);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  ProKey::~ProKey((ProKey *)0x2195e5);
  if (bVar1) {
    memset(local_f8,0xaa,0x30);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                   (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    QMakeEvaluator::first
              (&in_stack_fffffffffffffac8->super_QMakeEvaluator,in_stack_fffffffffffffac0);
    ProKey::~ProKey((ProKey *)0x21965b);
    QString::QString((QString *)in_stack_fffffffffffffab8,in_stack_fffffffffffffae8);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffffab8,(QString *)in_stack_fffffffffffffab0,
                       (bool)in_stack_fffffffffffffaaf);
    QString::~QString((QString *)0x2196aa);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                     (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
      QMakeEvaluator::first
                (&in_stack_fffffffffffffac8->super_QMakeEvaluator,in_stack_fffffffffffffac0);
      ProString::operator+=
                ((ProString *)in_stack_fffffffffffffab0,
                 (ProString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
      ProString::~ProString((ProString *)0x219718);
      ProKey::~ProKey((ProKey *)0x219725);
    }
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffffab0,
               (ProString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                   (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    QMakeProject::values
              (in_stack_fffffffffffffab0,
               (ProKey *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffffab0,
               (ProStringList *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProKey::~ProKey((ProKey *)0x219791);
    ProStringList::~ProStringList((ProStringList *)0x21979e);
    ProString::~ProString((ProString *)0x2197ab);
  }
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"DISTNAME      = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  MakefileGenerator::fileVar
            ((MakefileGenerator *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  QTextStream::operator<<(pQVar2,(QString *)local_200);
  ::operator<<((QTextStream *)in_stack_fffffffffffffab0,
               (QTextStreamFunction)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QString::~QString((QString *)0x219823);
  ProKey::~ProKey((ProKey *)0x219830);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  ProKey::~ProKey((ProKey *)0x21987b);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                   (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    QMakeEvaluator::first
              (&in_stack_fffffffffffffac8->super_QMakeEvaluator,in_stack_fffffffffffffac0);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffffab0,
               (ProString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                   (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    QMakeProject::values
              (in_stack_fffffffffffffab0,
               (ProKey *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffffab0,
               (ProStringList *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    ProKey::~ProKey((ProKey *)0x219936);
    ProStringList::~ProStringList((ProStringList *)0x219943);
    ProString::~ProString((ProString *)0x219950);
    ProKey::~ProKey((ProKey *)0x21995d);
  }
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"DISTDIR = ");
  canon = (undefined1)((ulong)in_RSI >> 0x38);
  this_01 = (QMakeProject *)in_RDI[9].d.d;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  local_4b1 = QMakeProject::isEmpty(this_01,(ProKey *)pQVar2);
  if (local_4b1) {
    ProString::ProString((ProString *)in_stack_fffffffffffffab0,(char *)this_01);
  }
  else {
    in_stack_fffffffffffffab8 = (QMakeProject *)in_RDI[9].d.d;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffab0,
                   (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    QMakeEvaluator::first(&this_01->super_QMakeEvaluator,(ProKey *)pQVar2);
  }
  local_4b1 = !local_4b1;
  this_00 = (QStringBuilder<ProString,_ProString> *)in_RDI[9].d.d;
  ProKey::ProKey((ProKey *)this_00,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QMakeEvaluator::first(&this_01->super_QMakeEvaluator,(ProKey *)pQVar2);
  ::operator+((ProString *)in_stack_fffffffffffffab8,&this_00->a);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<ProString,_ProString> *)
             CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
  MakefileGenerator::fileFixify
            (in_stack_fffffffffffffb60,file,(FileFixifyTypes)in_stack_0000000c.i,(bool)canon);
  (**(code **)&(in_RDI->d).d[6].super_QArrayData)(local_320,in_RDI,local_338);
  QTextStream::operator<<(pQVar2,(QString *)local_320);
  ::operator<<((QTextStream *)this_00,
               (QTextStreamFunction)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QString::~QString((QString *)0x219b21);
  QString::~QString((QString *)0x219b2e);
  QString::~QString((QString *)0x219b3b);
  QStringBuilder<ProString,_ProString>::~QStringBuilder(this_00);
  ProString::~ProString((ProString *)0x219b55);
  ProKey::~ProKey((ProKey *)0x219b62);
  ProString::~ProString((ProString *)0x219b6f);
  if (local_4b1) {
    ProKey::~ProKey((ProKey *)0x219b88);
  }
  ProKey::~ProKey((ProKey *)0x219b95);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
UnixMakefileGenerator::writeDefaultVariables(QTextStream &t)
{
    MakefileGenerator::writeDefaultVariables(t);
    t << "TAR           = " << var("QMAKE_TAR") << Qt::endl;
    t << "COMPRESS      = " << var("QMAKE_GZIP") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTNAME")) {
        ProString distname = project->first("QMAKE_ORIG_TARGET");
        if (!project->isActiveConfig("no_dist_version"))
            distname += project->first("VERSION");
        project->values("QMAKE_DISTNAME") = distname;
    }
    t << "DISTNAME      = " << fileVar("QMAKE_DISTNAME") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTDIR"))
        project->values("QMAKE_DISTDIR") = project->first("QMAKE_DISTNAME");
    t << "DISTDIR = " << escapeFilePath(fileFixify(
            (project->isEmpty("OBJECTS_DIR") ? ProString(".tmp/") : project->first("OBJECTS_DIR")) + project->first("QMAKE_DISTDIR"),
            FileFixifyFromOutdir | FileFixifyAbsolute)) << Qt::endl;
}